

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

_Bool tree_sitter_gdscript_external_scanner_scan(void *payload,TSLexer *lexer,_Bool *valid_symbols)

{
  ushort uVar1;
  _Bool _Var2;
  TSSymbol TVar3;
  int iVar4;
  uint uVar5;
  int32_t iVar6;
  void *pvVar7;
  undefined8 in_RCX;
  uint *puVar8;
  uint uVar9;
  byte bVar10;
  size_t sVar11;
  bool bVar12;
  byte bVar13;
  uint uVar14;
  Delimiter local_4e;
  byte local_4d;
  uint local_4c;
  undefined8 *local_48;
  Delimiter delimiter;
  
  if (valid_symbols[4] == true) {
    local_4c = (uint)CONCAT71((int7)((ulong)in_RCX >> 8),valid_symbols[1]);
  }
  else {
    local_4c = 0;
  }
  local_4d = 1;
  if ((valid_symbols[9] == false) && (valid_symbols[7] == false)) {
    local_4d = valid_symbols[8];
  }
  local_48 = (undefined8 *)payload;
  if (valid_symbols[4] != false) {
    iVar4 = **(int **)((long)payload + 8);
    if (iVar4 != 0 && (local_4c & 1) == 0) {
      bVar10 = *(byte *)(*(long *)(*(int **)((long)payload + 8) + 2) + (ulong)(iVar4 - 1));
      delimiter.flags = bVar10;
      iVar6 = end_character(&delimiter);
      _Var2 = false;
      do {
        while (iVar4 = lexer->lookahead, iVar4 == 0x5c) {
          if ((bVar10 & 8) == 0) {
            (*lexer->mark_end)(lexer);
            if ((bVar10 & 0x40) == 0) {
LAB_00104676:
              lexer->result_symbol = 4;
              return _Var2;
            }
            (*lexer->advance)(lexer,false);
            uVar5 = lexer->lookahead - 0x4e;
            if ((0x27 < uVar5) || ((0x8000000081U >> ((ulong)uVar5 & 0x3f) & 1) == 0))
            goto LAB_00104676;
            (*lexer->advance)(lexer,false);
            goto LAB_001043c6;
          }
          (*lexer->advance)(lexer,false);
          if (lexer->lookahead == iVar6 || lexer->lookahead == 0x5c) {
            (*lexer->advance)(lexer,false);
          }
        }
        if (iVar4 == 0) break;
        if (((iVar4 == 0x7d) || (iVar4 == 0x7b)) && ((bVar10 & 0x10) != 0)) {
          (*lexer->mark_end)(lexer);
          goto LAB_00104676;
        }
        if (iVar4 == iVar6) {
          if ((bVar10 & 0x20) == 0) {
            TVar3 = 4;
            if (_Var2 == false) {
              (*lexer->advance)(lexer,false);
              *(int *)local_48[1] = *(int *)local_48[1] + -1;
              TVar3 = 5;
            }
            lexer->result_symbol = TVar3;
            (*lexer->mark_end)(lexer);
            return true;
          }
          (*lexer->mark_end)(lexer);
          (*lexer->advance)(lexer,false);
          if ((lexer->lookahead == iVar6) &&
             ((*lexer->advance)(lexer,false), lexer->lookahead == iVar6)) {
            if (_Var2 == false) {
              (*lexer->advance)(lexer,false);
              (*lexer->mark_end)(lexer);
              *(int *)local_48[1] = *(int *)local_48[1] + -1;
              lexer->result_symbol = 5;
              return true;
            }
          }
          else {
            (*lexer->mark_end)(lexer);
          }
          lexer->result_symbol = 4;
          return true;
        }
        if ((!(bool)(~_Var2 & 1) && iVar4 == 10) && ((bVar10 & 0x20) == 0)) {
          return false;
        }
LAB_001043c6:
        (*lexer->advance)(lexer,false);
        _Var2 = true;
      } while( true );
    }
  }
  (*lexer->mark_end)(lexer);
  uVar5 = 0xffffffff;
  bVar12 = false;
  uVar14 = 0;
  do {
    iVar4 = lexer->lookahead;
    if (iVar4 - 0xcU < 2) {
LAB_0010421a:
      uVar14 = 0;
    }
    else if (iVar4 == 9) {
      uVar14 = uVar14 + 8;
    }
    else {
      if (iVar4 == 10) {
        bVar12 = true;
        goto LAB_0010421a;
      }
      if (iVar4 == 0x5c) {
        (*lexer->advance)(lexer,true);
        iVar4 = lexer->lookahead;
        if (iVar4 == 0xd) {
          (*lexer->advance)(lexer,true);
          iVar4 = lexer->lookahead;
        }
        if ((iVar4 != 10) && (_Var2 = (*lexer->eof)(lexer), !_Var2)) {
          return false;
        }
      }
      else {
        if (iVar4 == 0x23) {
          if (uVar5 == 0xffffffff) {
            uVar5 = uVar14;
          }
          iVar4 = 0x23;
          while ((iVar4 != 0 && (iVar4 != 10))) {
            (*lexer->advance)(lexer,true);
            iVar4 = lexer->lookahead;
          }
          goto LAB_0010421a;
        }
        if (iVar4 != 0x20) {
          _Var2 = (*lexer->eof)(lexer);
          if (_Var2) {
            uVar14 = 0;
          }
          if (bVar12 || _Var2) {
            puVar8 = (uint *)*local_48;
            uVar9 = *puVar8;
            if (uVar9 != 0) {
              pvVar7 = *(void **)(puVar8 + 2);
              uVar1 = *(ushort *)((long)pvVar7 + (ulong)(uVar9 - 1) * 2);
              if ((valid_symbols[1] == true) && (uVar1 < uVar14)) {
                if (puVar8[1] == uVar9) {
                  sVar11 = 0x20;
                  if (0xf < uVar9 * 2) {
                    sVar11 = (ulong)(uVar9 * 2) * 2;
                  }
                  pvVar7 = realloc(pvVar7,sVar11);
                  if (pvVar7 == (void *)0x0) {
                    __assert_fail("tmp != NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                                  ,0x13b,
                                  "_Bool tree_sitter_gdscript_external_scanner_scan(void *, TSLexer *, const _Bool *)"
                                 );
                  }
                  puVar8 = (uint *)*local_48;
                  *(void **)(puVar8 + 2) = pvVar7;
                  uVar9 = *puVar8;
                  uVar5 = 0x10;
                  if (0x10 < uVar9 * 2) {
                    uVar5 = uVar9 * 2;
                  }
                  puVar8[1] = uVar5;
                }
                *puVar8 = uVar9 + 1;
                *(short *)((long)pvVar7 + (ulong)uVar9 * 2) = (short)uVar14;
                lexer->result_symbol = 1;
                return true;
              }
              if (((valid_symbols[2] != false) ||
                  ((*valid_symbols == false && (((local_4d | valid_symbols[3]) & 1) == 0)))) &&
                 ((int)uVar5 < (int)(uint)uVar1 && uVar14 < uVar1)) {
                *puVar8 = uVar9 - 1;
                lexer->result_symbol = 2;
                return true;
              }
            }
            if (((~*valid_symbols | (byte)local_4c) & 1) == 0) {
              lexer->result_symbol = 0;
              return true;
            }
          }
          if (((((valid_symbols[10] == false) && (valid_symbols[7] == false)) &&
               (valid_symbols[9] == false)) && (valid_symbols[8] == false)) &&
             (((byte)local_4c != 0 || (valid_symbols[0xb] == true)))) {
            uVar14 = lexer->lookahead - 0x29;
            if (((uVar14 < 0x35) && ((0x10000000000009U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) ||
               (lexer->lookahead == 0x7d)) {
              if (valid_symbols[2] == true) {
                iVar4 = *(int *)*local_48;
                if (iVar4 != 0) {
                  *(int *)*local_48 = iVar4 + -1;
                }
              }
              lexer->result_symbol = 0xb;
              return true;
            }
          }
          if (uVar5 != 0xffffffff) {
            return false;
          }
          if (valid_symbols[3] != true) {
            return false;
          }
          bVar10 = 0;
          break;
        }
        uVar14 = uVar14 + 1;
      }
    }
    (*lexer->advance)(lexer,true);
  } while( true );
LAB_00104453:
  iVar4 = lexer->lookahead;
  if (iVar4 == 0x42) {
LAB_0010447f:
    bVar10 = bVar10 | 0x40;
  }
  else if (iVar4 == 0x46) {
LAB_00104485:
    bVar10 = bVar10 | 0x10;
  }
  else if (iVar4 == 0x52) {
LAB_0010448b:
    bVar10 = bVar10 | 8;
  }
  else if (iVar4 != 0x55) {
    if (iVar4 == 0x62) goto LAB_0010447f;
    if (iVar4 == 0x66) goto LAB_00104485;
    if (iVar4 == 0x72) goto LAB_0010448b;
    if (iVar4 != 0x75) {
      if (iVar4 == 0x22) {
        bVar13 = bVar10 | 2;
        local_4e.flags = bVar13;
        (*lexer->advance)(lexer,false);
        (*lexer->mark_end)(lexer);
        if ((lexer->lookahead == 0x22) && ((*lexer->advance)(lexer,false), lexer->lookahead == 0x22)
           ) {
          (*lexer->advance)(lexer,false);
          (*lexer->mark_end)(lexer);
          bVar13 = bVar10 | 0x22;
          local_4e.flags = bVar13;
        }
      }
      else if (iVar4 == 0x27) {
        bVar13 = bVar10 | 1;
        local_4e.flags = bVar13;
        (*lexer->advance)(lexer,false);
        (*lexer->mark_end)(lexer);
        if ((lexer->lookahead == 0x27) && ((*lexer->advance)(lexer,false), lexer->lookahead == 0x27)
           ) {
          (*lexer->advance)(lexer,false);
          (*lexer->mark_end)(lexer);
          bVar13 = bVar10 | 0x21;
          local_4e.flags = bVar13;
        }
      }
      else {
        bVar13 = bVar10;
        local_4e.flags = bVar10;
        if (iVar4 == 0x60) {
          local_4e.flags = bVar10 | 4;
          (*lexer->advance)(lexer,false);
          (*lexer->mark_end)(lexer);
          bVar13 = bVar10 | 4;
        }
      }
      iVar6 = end_character(&local_4e);
      if (iVar6 == 0) {
        return false;
      }
      puVar8 = (uint *)local_48[1];
      uVar5 = *puVar8;
      pvVar7 = *(void **)(puVar8 + 2);
      if (puVar8[1] == uVar5) {
        uVar5 = puVar8[1] * 2;
        sVar11 = (size_t)uVar5;
        if (uVar5 < 0x11) {
          sVar11 = 0x10;
        }
        pvVar7 = realloc(pvVar7,sVar11);
        if (pvVar7 == (void *)0x0) {
          __assert_fail("tmp != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                        ,0x1a5,
                        "_Bool tree_sitter_gdscript_external_scanner_scan(void *, TSLexer *, const _Bool *)"
                       );
        }
        puVar8 = (uint *)local_48[1];
        *(void **)(puVar8 + 2) = pvVar7;
        uVar5 = *puVar8;
        uVar14 = 0x10;
        if (0x10 < uVar5 * 2) {
          uVar14 = uVar5 * 2;
        }
        puVar8[1] = uVar14;
      }
      *puVar8 = uVar5 + 1;
      *(byte *)((long)pvVar7 + (ulong)uVar5) = bVar13;
      lexer->result_symbol = 3;
      return true;
    }
  }
  (*lexer->advance)(lexer,false);
  goto LAB_00104453;
}

Assistant:

bool tree_sitter_gdscript_external_scanner_scan(void *payload, TSLexer *lexer,
                                                const bool *valid_symbols) {
    Scanner *scanner = (Scanner *)payload;

    bool error_recovery_mode =
        valid_symbols[STRING_CONTENT] && valid_symbols[INDENT];
    bool within_brackets = valid_symbols[CLOSE_BRACE] ||
                           valid_symbols[CLOSE_PAREN] ||
                           valid_symbols[CLOSE_BRACKET];

    if (valid_symbols[STRING_CONTENT] && scanner->delimiters->len > 0 &&
        !error_recovery_mode) {
        Delimiter delimiter = VEC_BACK(scanner->delimiters);
        int32_t end_char = end_character(&delimiter);
        bool has_content = false;
        while (lexer->lookahead) {
            if ((lexer->lookahead == '{' || lexer->lookahead == '}') &&
                is_format(&delimiter)) {
                lexer->mark_end(lexer);
                lexer->result_symbol = STRING_CONTENT;
                return has_content;
            }
            if (lexer->lookahead == '\\') {
                if (is_raw(&delimiter)) {
                    // Step over the backslash.
                    lexer->advance(lexer, false);
                    // Step over any escaped quotes.
                    if (lexer->lookahead == end_character(&delimiter) ||
                        lexer->lookahead == '\\') {
                        lexer->advance(lexer, false);
                    }
                    continue;
                }
                if (is_bytes(&delimiter)) {
                    lexer->mark_end(lexer);
                    lexer->advance(lexer, false);
                    if (lexer->lookahead == 'N' || lexer->lookahead == 'u' ||
                        lexer->lookahead == 'U') {
                        // In bytes string, \N{...}, \uXXXX and \UXXXXXXXX are
                        // not escape sequences
                        // https://docs.python.org/3/reference/lexical_analysis.html#string-and-bytes-literals
                        lexer->advance(lexer, false);
                    } else {
                        lexer->result_symbol = STRING_CONTENT;
                        return has_content;
                    }
                } else {
                    lexer->mark_end(lexer);
                    lexer->result_symbol = STRING_CONTENT;
                    return has_content;
                }
            } else if (lexer->lookahead == end_char) {
                if (is_triple(&delimiter)) {
                    lexer->mark_end(lexer);
                    lexer->advance(lexer, false);
                    if (lexer->lookahead == end_char) {
                        lexer->advance(lexer, false);
                        if (lexer->lookahead == end_char) {
                            if (has_content) {
                                lexer->result_symbol = STRING_CONTENT;
                            } else {
                                lexer->advance(lexer, false);
                                lexer->mark_end(lexer);
                                VEC_POP(scanner->delimiters);
                                lexer->result_symbol = STRING_END;
                            }
                            return true;
                        }
                        lexer->mark_end(lexer);
                        lexer->result_symbol = STRING_CONTENT;
                        return true;
                    }
                    lexer->mark_end(lexer);
                    lexer->result_symbol = STRING_CONTENT;
                    return true;
                }
                if (has_content) {
                    lexer->result_symbol = STRING_CONTENT;
                } else {
                    lexer->advance(lexer, false);
                    VEC_POP(scanner->delimiters);
                    lexer->result_symbol = STRING_END;
                }
                lexer->mark_end(lexer);
                return true;

            } else if (lexer->lookahead == '\n' && has_content &&
                       !is_triple(&delimiter)) {
                return false;
            }
            advance(lexer);
            has_content = true;
        }
    }

    lexer->mark_end(lexer);

    bool found_end_of_line = false;
    uint32_t indent_length = 0;
    int32_t first_comment_indent_length = -1;
    for (;;) {
        if (lexer->lookahead == '\n') {
            found_end_of_line = true;
            indent_length = 0;
            skip(lexer);
        } else if (lexer->lookahead == ' ') {
            indent_length++;
            skip(lexer);
        } else if (lexer->lookahead == '\r' || lexer->lookahead == '\f') {
            indent_length = 0;
            skip(lexer);
        } else if (lexer->lookahead == '\t') {
            indent_length += 8;
            skip(lexer);
        } else if (lexer->lookahead == '#') {
            if (first_comment_indent_length == -1) {
                first_comment_indent_length = (int32_t)indent_length;
            }
            while (lexer->lookahead && lexer->lookahead != '\n') {
                skip(lexer);
            }
            skip(lexer);
            indent_length = 0;
        } else if (lexer->lookahead == '\\') {
            skip(lexer);
            if (lexer->lookahead == '\r') {
                skip(lexer);
            }
            if (lexer->lookahead == '\n' || lexer->eof(lexer)) {
                skip(lexer);
            } else {
                return false;
            }
        } else if (lexer->eof(lexer)) {
            indent_length = 0;
            found_end_of_line = true;
            break;
        } else {
            break;
        }
    }

    if (found_end_of_line) {
        if (scanner->indents->len > 0) {
            uint16_t current_indent_length = VEC_BACK(scanner->indents);

            if (valid_symbols[INDENT] &&
                indent_length > current_indent_length) {
                VEC_PUSH(scanner->indents, indent_length);
                lexer->result_symbol = INDENT;
                return true;
            }

            if ((valid_symbols[DEDENT] ||
                 (!valid_symbols[NEWLINE] && !valid_symbols[STRING_START] &&
                  !within_brackets)) &&
                indent_length < current_indent_length &&

                // Wait to create a dedent token until we've consumed any
                // comments
                // whose indentation matches the current block.
                first_comment_indent_length < (int32_t)current_indent_length) {
                VEC_POP(scanner->indents);
                lexer->result_symbol = DEDENT;
                return true;
            }
        }

        if (valid_symbols[NEWLINE] && !error_recovery_mode) {
            lexer->result_symbol = NEWLINE;
            return true;
        }
    }

    // This if statement can be placed before the above if statement that
    // handles newlines. However, it feels safer to give indentation and
    // newlines higher precedence.
    if (
        // Guard against BODY_END tokens overriding valid tokens.
        !valid_symbols[COMMA] &&
        /* !valid_symbols[COLON] && */
        !valid_symbols[CLOSE_PAREN] && !valid_symbols[CLOSE_BRACE] &&
        !valid_symbols[CLOSE_BRACKET] &&

        // Body ends occur in error recovery mode since the grammar does not
        // (cannot?) specify that a body can end with the below characters
        // without consuming them itself.
        (error_recovery_mode || valid_symbols[BODY_END])) {
        if (lexer->lookahead == ',' || // separator
            lexer->lookahead == ')' || // args, params, paren expr
            lexer->lookahead == '}' || // dictionary (may not be needed)
            lexer->lookahead == ']'    // array
            /* lexer->lookahead == ':'     // key-value pairs (breaks if
               elses) */
        ) {
            // BODY_END tokens can take the place of a dedent. Therefore, we
            // should pop the stack when DEDENT is valid.
            if (valid_symbols[DEDENT] && scanner->indents->len > 0) {
                VEC_POP(scanner->indents);
            }
            lexer->result_symbol = BODY_END;
            return true;
        }
    }

    if (first_comment_indent_length == -1 && valid_symbols[STRING_START]) {
        Delimiter delimiter = new_delimiter();

        bool has_flags = false;
        while (lexer->lookahead) {
            if (lexer->lookahead == 'f' || lexer->lookahead == 'F') {
                set_format(&delimiter);
            } else if (lexer->lookahead == 'r' || lexer->lookahead == 'R') {
                set_raw(&delimiter);
            } else if (lexer->lookahead == 'b' || lexer->lookahead == 'B') {
                set_bytes(&delimiter);
            } else if (lexer->lookahead != 'u' && lexer->lookahead != 'U') {
                break;
            }
            has_flags = true;
            advance(lexer);
        }

        if (lexer->lookahead == '`') {
            set_end_character(&delimiter, '`');
            advance(lexer);
            lexer->mark_end(lexer);
        } else if (lexer->lookahead == '\'') {
            set_end_character(&delimiter, '\'');
            advance(lexer);
            lexer->mark_end(lexer);
            if (lexer->lookahead == '\'') {
                advance(lexer);
                if (lexer->lookahead == '\'') {
                    advance(lexer);
                    lexer->mark_end(lexer);
                    set_triple(&delimiter);
                }
            }
        } else if (lexer->lookahead == '"') {
            set_end_character(&delimiter, '"');
            advance(lexer);
            lexer->mark_end(lexer);
            if (lexer->lookahead == '"') {
                advance(lexer);
                if (lexer->lookahead == '"') {
                    advance(lexer);
                    lexer->mark_end(lexer);
                    set_triple(&delimiter);
                }
            }
        }

        if (end_character(&delimiter)) {
            VEC_PUSH(scanner->delimiters, delimiter);
            lexer->result_symbol = STRING_START;

            return true;
        }
        if (has_flags) {
            return false;
        }
    }

    return false;
}